

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
calculator::ShiftNegativeException::~ShiftNegativeException(ShiftNegativeException *this)

{
  ShiftNegativeException *this_local;
  
  ~ShiftNegativeException(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

ShiftNegativeException() {
        error_msg = "Error: shift left/right negative count";
    }